

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

uchar * archive_entry_digest(archive_entry *entry,wchar_t type)

{
  wchar_t type_local;
  archive_entry *entry_local;
  
  switch(type) {
  case L'\x01':
    entry_local = (archive_entry *)&entry->digest;
    break;
  case L'\x02':
    entry_local = (archive_entry *)(entry->digest).rmd160;
    break;
  case L'\x03':
    entry_local = (archive_entry *)(entry->digest).sha1;
    break;
  case L'\x04':
    entry_local = (archive_entry *)(entry->digest).sha256;
    break;
  case L'\x05':
    entry_local = (archive_entry *)(entry->digest).sha384;
    break;
  case L'\x06':
    entry_local = (archive_entry *)(entry->digest).sha512;
    break;
  default:
    entry_local = (archive_entry *)0x0;
  }
  return (uchar *)entry_local;
}

Assistant:

const unsigned char *
archive_entry_digest(struct archive_entry *entry, int type)
{
	switch (type) {
	case ARCHIVE_ENTRY_DIGEST_MD5:
		return entry->digest.md5;
	case ARCHIVE_ENTRY_DIGEST_RMD160:
		return entry->digest.rmd160;
	case ARCHIVE_ENTRY_DIGEST_SHA1:
		return entry->digest.sha1;
	case ARCHIVE_ENTRY_DIGEST_SHA256:
		return entry->digest.sha256;
	case ARCHIVE_ENTRY_DIGEST_SHA384:
		return entry->digest.sha384;
	case ARCHIVE_ENTRY_DIGEST_SHA512:
		return entry->digest.sha512;
	default:
		return NULL;
	}
}